

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decompiler.cc
# Opt level: O0

void __thiscall
wabt::Decompiler::IndentValue(Decompiler *this,Value *val,size_t amount,string_view first_indent)

{
  size_type sVar1;
  bool bVar2;
  reference pbVar3;
  reference pvVar4;
  const_pointer pcVar5;
  undefined1 local_80 [8];
  string_view is;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *stat;
  iterator __end2;
  iterator __begin2;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range2;
  string indent;
  size_t amount_local;
  Value *val_local;
  Decompiler *this_local;
  string_view first_indent_local;
  
  first_indent_local.data_ = (char *)first_indent.size_;
  this_local = (Decompiler *)first_indent.data_;
  indent.field_2._8_8_ = amount;
  Indent_abi_cxx11_((string *)&__range2,this,amount);
  __end2 = std::
           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::begin(&val->v);
  stat = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
         std::
         vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ::end(&val->v);
  do {
    bVar2 = __gnu_cxx::operator!=
                      (&__end2,(__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                *)&stat);
    if (!bVar2) {
      std::__cxx11::string::~string((string *)&__range2);
      return;
    }
    pbVar3 = __gnu_cxx::
             __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator*(&__end2);
    is.size_ = (size_type)pbVar3;
    pvVar4 = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::operator[](&val->v,0);
    if (pbVar3 == pvVar4) {
      bVar2 = string_view::empty((string_view *)&this_local);
      if (bVar2) goto LAB_00280095;
      local_80 = (undefined1  [8])this_local;
      is.data_ = first_indent_local.data_;
    }
    else {
LAB_00280095:
      string_view::string_view((string_view *)local_80,(string *)&__range2);
    }
    sVar1 = is.size_;
    pcVar5 = string_view::data((string_view *)local_80);
    string_view::size((string_view *)local_80);
    std::__cxx11::string::insert(sVar1,(char *)0x0,(ulong)pcVar5);
    __gnu_cxx::
    __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::operator++(&__end2);
  } while( true );
}

Assistant:

void IndentValue(Value &val, size_t amount, string_view first_indent) {
    auto indent = Indent(amount);
    for (auto& stat : val.v) {
      auto is = (&stat != &val.v[0] || first_indent.empty())
                    ? string_view(indent)
                    : first_indent;
      stat.insert(0, is.data(), is.size());
    }
  }